

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O3

NodeRef __thiscall
embree::avx::BVHNBuilderQuantizedVirtual<8>::
BVHNBuilderT<embree::avx::CreateLeafQuantized<8,_embree::TriangleM<4>_>_>::createLeaf
          (BVHNBuilderT<embree::avx::CreateLeafQuantized<8,_embree::TriangleM<4>_>_> *this,
          PrimRef *prims,range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  undefined4 *puVar2;
  undefined4 *puVar3;
  pointer *pppTVar4;
  uint uVar5;
  uint uVar6;
  undefined4 uVar7;
  FastAllocator *this_00;
  ThreadLocal *pTVar8;
  ThreadLocal2 *pTVar9;
  iterator __position;
  Ref<embree::Geometry> *pRVar10;
  Geometry *pGVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined8 uVar22;
  ulong uVar23;
  char *pcVar24;
  undefined1 (*pauVar25) [16];
  size_t sVar26;
  ulong uVar27;
  long lVar28;
  unsigned_long uVar29;
  long lVar30;
  uint *puVar31;
  ulong uVar32;
  long lVar33;
  undefined1 auVar34 [32];
  undefined1 in_ZMM1 [64];
  undefined1 in_ZMM2 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  vuint<4> vgeomID;
  Vec3vf<4> v0;
  Vec3vf<4> v1;
  Vec3vf<4> v2;
  vuint<4> vprimID;
  undefined1 local_108 [16];
  ulong local_f8;
  PrimRef *local_f0;
  ThreadLocal2 *local_e8;
  undefined1 uStack_e0;
  undefined7 uStack_df;
  undefined1 auStack_d8 [16];
  undefined1 auStack_c8 [16];
  ThreadLocal2 *local_b8;
  char cStack_b0;
  undefined7 uStack_af;
  undefined1 auStack_a8 [16];
  undefined1 auStack_98 [16];
  long local_88;
  BVHNBuilderT<embree::avx::CreateLeafQuantized<8,_embree::TriangleM<4>_>_> *local_80;
  ThreadLocal2 *local_78;
  undefined8 uStack_70;
  undefined1 auStack_68 [16];
  undefined1 auStack_58 [16];
  undefined1 local_48 [16];
  
  auVar36 = in_ZMM2._0_16_;
  auVar35 = in_ZMM1._0_16_;
  uVar29 = set->_begin;
  uVar23 = (set->_end - uVar29) + 3;
  local_f8 = uVar23 >> 2;
  this_00 = alloc->alloc;
  pTVar8 = alloc->talloc1;
  local_108._8_8_ = local_108._0_8_;
  local_108._0_8_ = local_f8 * 0xb0;
  pTVar9 = pTVar8->parent;
  local_f0 = prims;
  if (this_00 != (pTVar9->alloc)._M_b._M_p) {
    cStack_b0 = '\x01';
    local_b8 = pTVar9;
    MutexSys::lock(&pTVar9->mutex);
    if ((pTVar9->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((pTVar9->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar9->alloc1).bytesUsed + (pTVar9->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar9->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar9->alloc0).end + (pTVar9->alloc1).end) -
           ((pTVar9->alloc0).cur + (pTVar9->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar9->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar9->alloc1).bytesWasted + (pTVar9->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar34 = ZEXT1632(ZEXT816(0) << 0x40);
    (pTVar9->alloc0).end = auVar34._0_8_;
    (pTVar9->alloc0).allocBlockSize = auVar34._8_8_;
    (pTVar9->alloc0).bytesUsed = auVar34._16_8_;
    (pTVar9->alloc0).bytesWasted = auVar34._24_8_;
    (pTVar9->alloc0).ptr = (char *)auVar34._0_8_;
    (pTVar9->alloc0).cur = auVar34._8_8_;
    (pTVar9->alloc0).end = auVar34._16_8_;
    (pTVar9->alloc0).allocBlockSize = auVar34._24_8_;
    auVar34 = ZEXT1632(ZEXT816(0) << 0x40);
    if (this_00 == (FastAllocator *)0x0) {
      (pTVar9->alloc1).end = auVar34._0_8_;
      (pTVar9->alloc1).allocBlockSize = auVar34._8_8_;
      (pTVar9->alloc1).bytesUsed = auVar34._16_8_;
      (pTVar9->alloc1).bytesWasted = auVar34._24_8_;
      (pTVar9->alloc1).ptr = (char *)auVar34._0_8_;
      (pTVar9->alloc1).cur = auVar34._8_8_;
      (pTVar9->alloc1).end = auVar34._16_8_;
      (pTVar9->alloc1).allocBlockSize = auVar34._24_8_;
    }
    else {
      (pTVar9->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (pTVar9->alloc1).ptr = (char *)auVar34._0_8_;
      (pTVar9->alloc1).cur = auVar34._8_8_;
      (pTVar9->alloc1).end = auVar34._16_8_;
      (pTVar9->alloc1).allocBlockSize = auVar34._24_8_;
      (pTVar9->alloc1).end = auVar34._0_8_;
      (pTVar9->alloc1).allocBlockSize = auVar34._8_8_;
      (pTVar9->alloc1).bytesUsed = auVar34._16_8_;
      (pTVar9->alloc1).bytesWasted = auVar34._24_8_;
      (pTVar9->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (pTVar9->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_e8 = (ThreadLocal2 *)&FastAllocator::s_thread_local_allocators_lock;
    uStack_e0 = 1;
    in_ZMM1 = ZEXT1664(auVar35);
    in_ZMM2 = ZEXT1664(auVar36);
    local_78 = pTVar9;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,&local_78);
    }
    else {
      *__position._M_current = pTVar9;
      pppTVar4 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar4 = *pppTVar4 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (cStack_b0 == '\x01') {
      MutexSys::unlock(&local_b8->mutex);
    }
  }
  uVar22 = local_108._0_8_;
  pTVar8->bytesUsed = (long)&((MutexSys *)local_108._0_8_)->mutex + pTVar8->bytesUsed;
  sVar26 = pTVar8->cur;
  uVar27 = (ulong)(-(int)sVar26 & 0xf);
  uVar32 = (long)&((MutexSys *)local_108._0_8_)->mutex + uVar27 + sVar26;
  pTVar8->cur = uVar32;
  if (pTVar8->end < uVar32) {
    pTVar8->cur = sVar26;
    pTVar9 = (ThreadLocal2 *)pTVar8->allocBlockSize;
    if ((ThreadLocal2 *)(local_108._0_8_ * 4) < pTVar9 || local_108._0_8_ * 4 - (long)pTVar9 == 0) {
      local_e8 = pTVar9;
      pcVar24 = (char *)FastAllocator::malloc(this_00,(size_t)&local_e8);
      pTVar8->ptr = pcVar24;
      sVar26 = (pTVar8->end - pTVar8->cur) + pTVar8->bytesWasted;
      pTVar8->bytesWasted = sVar26;
      pTVar8->end = (size_t)local_e8;
      pTVar8->cur = uVar22;
      if (local_e8 < (ulong)uVar22) {
        pTVar8->cur = 0;
        local_e8 = (ThreadLocal2 *)pTVar8->allocBlockSize;
        pcVar24 = (char *)FastAllocator::malloc(this_00,(size_t)&local_e8);
        pTVar8->ptr = pcVar24;
        sVar26 = (pTVar8->end - pTVar8->cur) + pTVar8->bytesWasted;
        pTVar8->bytesWasted = sVar26;
        pTVar8->end = (size_t)local_e8;
        pTVar8->cur = uVar22;
        if (local_e8 < (ulong)uVar22) {
          pTVar8->cur = 0;
          pcVar24 = (char *)0x0;
          goto LAB_012aa7d5;
        }
      }
      pTVar8->bytesWasted = sVar26;
    }
    else {
      pcVar24 = (char *)FastAllocator::malloc(this_00,(size_t)local_108);
    }
  }
  else {
    pTVar8->bytesWasted = pTVar8->bytesWasted + uVar27;
    pcVar24 = pTVar8->ptr + (uVar32 - local_108._0_8_);
  }
LAB_012aa7d5:
  if (3 < uVar23) {
    lVar30 = local_f8 + (local_f8 == 0);
    local_f0 = (PrimRef *)((long)&(local_f0->upper).field_0 + 0xc);
    lVar28 = 0;
    local_e8 = (ThreadLocal2 *)0x0;
    pTVar9 = local_e8;
    local_88 = lVar30;
    local_80 = this;
    do {
      uVar23 = set->_end;
      local_48 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
      auStack_c8 = (undefined1  [16])0x0;
      uStack_e0 = 0;
      uStack_df = 0;
      auStack_d8 = (undefined1  [16])0x0;
      auStack_98 = (undefined1  [16])0x0;
      auStack_a8 = (undefined1  [16])0x0;
      auStack_58 = (undefined1  [16])0x0;
      uStack_70 = 0;
      auStack_68 = (undefined1  [16])0x0;
      auVar35 = ZEXT816(0) << 0x40;
      if (uVar29 < uVar23) {
        pRVar10 = (((this->createLeafFunc).bvh)->scene->geometries).items;
        puVar31 = (uint *)((long)local_f0 + uVar29 * 0x20);
        uVar32 = 0;
        local_108 = local_48;
        local_e8 = pTVar9;
        local_b8 = pTVar9;
        cStack_b0 = uStack_e0;
        uStack_af = uStack_df;
        local_78 = pTVar9;
        do {
          uVar5 = puVar31[-4];
          uVar6 = *puVar31;
          pGVar11 = pRVar10[uVar5].ptr;
          lVar33 = (ulong)uVar6 *
                   pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          lVar30 = *(long *)&pGVar11->field_0x58;
          lVar12 = *(long *)&pGVar11[1].time_range.upper;
          p_Var13 = pGVar11[1].intersectionFilterN;
          puVar2 = (undefined4 *)(lVar12 + (ulong)*(uint *)(lVar30 + lVar33) * (long)p_Var13);
          uVar7 = puVar2[1];
          uVar18 = puVar2[2];
          puVar3 = (undefined4 *)(lVar12 + (ulong)*(uint *)(lVar30 + 4 + lVar33) * (long)p_Var13);
          uVar19 = *puVar3;
          uVar20 = puVar3[1];
          uVar21 = puVar3[2];
          auVar35 = *(undefined1 (*) [16])
                     (lVar12 + (ulong)*(uint *)(lVar30 + 8 + lVar33) * (long)p_Var13);
          *(undefined4 *)((long)&local_e8 + uVar32 * 4) = *puVar2;
          *(undefined4 *)(auStack_d8 + uVar32 * 4) = uVar7;
          *(undefined4 *)(auStack_c8 + uVar32 * 4) = uVar18;
          *(undefined4 *)((long)&local_b8 + uVar32 * 4) = uVar19;
          *(undefined4 *)(auStack_a8 + uVar32 * 4) = uVar20;
          *(undefined4 *)(auStack_98 + uVar32 * 4) = uVar21;
          *(int *)((long)&local_78 + uVar32 * 4) = auVar35._0_4_;
          uVar7 = vextractps_avx(auVar35,1);
          *(undefined4 *)(auStack_68 + uVar32 * 4) = uVar7;
          uVar7 = vextractps_avx(auVar35,2);
          *(undefined4 *)(auStack_58 + uVar32 * 4) = uVar7;
          *(uint *)(local_108 + uVar32 * 4) = uVar5;
          *(uint *)(local_48 + uVar32 * 4) = uVar6;
          uVar27 = uVar32 + 1;
          if (2 < uVar32) break;
          lVar30 = uVar32 + uVar29;
          puVar31 = puVar31 + 8;
          uVar32 = uVar27;
        } while (lVar30 + 1U < uVar23);
        auVar36[8] = uStack_e0;
        auVar36._0_8_ = local_e8;
        auVar36._9_7_ = uStack_df;
        auVar38[8] = cStack_b0;
        auVar38._0_8_ = local_b8;
        auVar38._9_7_ = uStack_af;
        auVar37._8_8_ = uStack_70;
        auVar37._0_8_ = local_78;
        uVar29 = uVar29 + uVar27;
        lVar30 = local_88;
        this = local_80;
        auVar35 = auStack_58;
      }
      else {
        local_108 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
        auStack_68 = ZEXT816(0) << 0x40;
        auVar37 = ZEXT816(0) << 0x40;
        auStack_98 = ZEXT816(0) << 0x40;
        auStack_a8 = ZEXT816(0) << 0x40;
        auVar38 = ZEXT816(0) << 0x40;
        auStack_c8 = ZEXT816(0) << 0x40;
        auStack_d8 = ZEXT816(0) << 0x40;
        auVar36 = ZEXT816(0) << 0x40;
      }
      in_ZMM2 = ZEXT1664(local_108);
      in_ZMM1 = ZEXT1664(local_48);
      pauVar25 = (undefined1 (*) [16])(pcVar24 + lVar28 * 0xb0);
      auVar38 = vsubps_avx(auVar36,auVar38);
      auVar14 = vsubps_avx(auStack_d8,auStack_a8);
      auVar15 = vsubps_avx(auStack_c8,auStack_98);
      auVar37 = vsubps_avx(auVar37,auVar36);
      auVar16 = vsubps_avx(auStack_68,auStack_d8);
      auVar17 = vsubps_avx(auVar35,auStack_c8);
      auVar35 = vmovntps_avx(auVar36);
      *pauVar25 = auVar35;
      auVar35 = vmovntps_avx(auStack_d8);
      pauVar25[1] = auVar35;
      auVar35 = vmovntps_avx(auStack_c8);
      pauVar25[2] = auVar35;
      auVar35 = vmovntps_avx(auVar38);
      pauVar25[3] = auVar35;
      auVar35 = vmovntps_avx(auVar14);
      pauVar25[4] = auVar35;
      auVar35 = vmovntps_avx(auVar15);
      pauVar25[5] = auVar35;
      auVar35 = vmovntps_avx(auVar37);
      pauVar25[6] = auVar35;
      auVar35 = vmovntps_avx(auVar16);
      pauVar25[7] = auVar35;
      auVar35 = vmovntps_avx(auVar17);
      pauVar25[8] = auVar35;
      auVar35 = vmovntdq_avx(local_108);
      pauVar25[9] = auVar35;
      auVar35 = vmovntdq_avx(local_48);
      pauVar25[10] = auVar35;
      lVar28 = lVar28 + 1;
    } while (lVar28 != lVar30);
  }
  uVar23 = 7;
  if (local_f8 < 7) {
    uVar23 = local_f8;
  }
  return (NodeRef)(uVar23 | (ulong)pcVar24 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }